

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MANU.cpp
# Opt level: O1

bool check(int i)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  iVar1 = local_time();
  iVar3 = ITEM[i].span;
  iVar7 = (iVar3 % 0x16d) / 0x1e;
  iVar5 = ITEM[i].manu;
  uVar2 = iVar5 / 10000 + iVar3 / 0x16d;
  uVar4 = (iVar5 % 10000) / 100 + iVar7;
  iVar3 = iVar5 % 100 + iVar3 + iVar7 * -10;
  uVar6 = 0x1e;
  if (uVar4 < 0xd) {
    if ((0x15aaU >> (uVar4 & 0x1f) & 1) == 0) {
      if (uVar4 == 2) {
        uVar6 = ((uVar2 * -0x3d70a3d7 + 0x51eb850 >> 2 | uVar2 * 0x40000000) < 0x28f5c29 ||
                (uVar2 & 3) != 0) ^ 0x1d;
      }
    }
    else {
      uVar6 = 0x1f;
    }
  }
  iVar5 = uVar4 + ((int)uVar6 < iVar3);
  if (iVar1 / 10000 <= (int)(uVar2 + (0xc < iVar5))) {
    iVar7 = iVar5 + -0xc;
    if (iVar5 < 0xd) {
      iVar7 = iVar5;
    }
    uVar2 = 0;
    if ((int)uVar6 < iVar3) {
      uVar2 = uVar6;
    }
    if (((iVar1 % 10000) / 100 <= iVar7) && (iVar1 % 100 <= (int)(iVar3 - uVar2))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool check(int i) {
    int now = local_time(), sy = ITEM[i].span / 365,
            sm = (ITEM[i].span - sy * 365) / 30, sd = ITEM[i].span - sm * 10,
            my = ITEM[i].manu / 10000, mm = (ITEM[i].manu % 10000) / 100,
            md = ITEM[i].manu % 100, dmax;
    bool ok = true;

    my += sy;
    mm += sm;
    md += sd;
    switch (mm) {
        case 2:
            if (my % 4 || !(my % 100)) {
                dmax = 28;
            } else {
                dmax = 29;
            }
            break;
        case 4:
        case 6:
        case 9:
        case 11:
            dmax = 30;
            break;
        case 1:
        case 3:
        case 5:
        case 7:
        case 8:
        case 10:
        case 12:
            dmax = 31;
    }
    if(md > dmax) {
        mm++;
        md -= dmax;
    }
    if(mm > 12) {
        my++;
        mm -= 12;
    }
    if (now / 10000 > my || (now % 10000) / 100 > mm || now % 100 > md) {
        ok = false;
    }
    return ok;
}